

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O1

void __thiscall
Assimp::IRRImporter::BuildSkybox
          (IRRImporter *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials)

{
  map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
  *pmVar1;
  iterator iVar2;
  IRRImporter *this_00;
  int iVar3;
  IRRImporter *this_01;
  uint i;
  long lVar4;
  int shading;
  aiString s;
  aiMesh *local_4b0;
  IRRImporter *local_4a8;
  undefined1 local_4a0 [8];
  undefined8 uStack_498;
  undefined8 local_490;
  aiVector3D aStack_488;
  undefined1 local_47c [8];
  undefined8 uStack_474;
  undefined8 local_46c;
  aiVector3D aStack_464;
  undefined1 local_458 [8];
  undefined8 uStack_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  undefined1 local_434 [8];
  undefined8 uStack_42c;
  float local_424;
  float fStack_420;
  float fStack_41c;
  float fStack_418;
  float local_414;
  
  lVar4 = 0;
  local_4a8 = (IRRImporter *)meshes;
  do {
    this_01 = (IRRImporter *)
              (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
              super__Vector_impl_data._M_finish[lVar4 + -6];
    local_434 = (undefined1  [8])((ulong)local_434 & 0xffffff0000000000);
    memset(local_434 + 5,0x1b,0x3ff);
    iVar3 = snprintf(local_434 + 4,0x400,"SkyboxSide_%u");
    local_434._0_4_ = iVar3;
    aiMaterial::AddProperty((aiMaterial *)this_01,(aiString *)local_434,"?mat.name",0,0);
    local_4a0._0_4_ = 1.26117e-44;
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)this_01,local_4a0,4,"$mat.shadingm",0,0,aiPTI_Integer);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_434._0_4_ = 0xc1200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  uStack_42c._0_1_ = '\0';
  uStack_42c._1_1_ = '\0';
  uStack_42c._2_1_ = ' ';
  uStack_42c._3_1_ = -0x3f;
  uStack_42c._4_1_ = '\0';
  uStack_42c._5_1_ = '\0';
  uStack_42c._6_1_ = '\0';
  uStack_42c._7_1_ = '\0';
  local_424 = 0.0;
  fStack_420 = 1.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0._0_4_ = 10.0;
  local_4a0._4_4_ = -10.0;
  uStack_498._0_4_ = -10.0;
  uStack_498._4_4_ = 0.0;
  local_490._0_4_ = 0.0;
  local_490._4_4_ = 1.0;
  aStack_488.x = 0.0;
  aStack_488.y = 1.0;
  aStack_488.z = 0.0;
  local_458._0_4_ = 10.0;
  local_458._4_4_ = 10.0;
  uStack_450._0_4_ = -10.0;
  uStack_450._4_4_ = 0.0;
  local_448 = 0.0;
  fStack_444 = 1.0;
  fStack_440 = 0.0;
  fStack_43c = 0.0;
  local_438 = 0.0;
  local_47c._0_4_ = -10.0;
  local_47c._4_4_ = 10.0;
  uStack_474._0_4_ = -10.0;
  uStack_474._4_4_ = 0.0;
  local_46c._0_4_ = 0.0;
  local_46c._4_4_ = 1.0;
  aStack_464.x = 1.0;
  aStack_464.y = 0.0;
  aStack_464.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_434,(SkyboxVertex *)local_4a0,
                                  (SkyboxVertex *)local_458,(SkyboxVertex *)local_47c);
  this_00 = local_4a8;
  iVar2._M_current = *(aiMesh ***)&(local_4a8->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar2._M_current ==
      *(aiMesh ***)
       &(local_4a8->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header)
  {
    this_01 = local_4a8;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_4a8,iVar2,&local_4b0);
  }
  else {
    *iVar2._M_current = local_4b0;
    pmVar1 = &(local_4a8->super_BaseImporter).importerUnits;
    *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
  }
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -6;
  local_434._0_4_ = 0x41200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  uStack_42c._0_1_ = '\0';
  uStack_42c._1_1_ = '\0';
  uStack_42c._2_1_ = ' ';
  uStack_42c._3_1_ = -0x3f;
  uStack_42c._4_1_ = '\0';
  uStack_42c._5_1_ = '\0';
  uStack_42c._6_1_ = -0x80;
  uStack_42c._7_1_ = -0x41;
  local_424 = 0.0;
  fStack_420 = 0.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0._0_4_ = 10.0;
  local_4a0._4_4_ = -10.0;
  uStack_498._0_4_ = 10.0;
  uStack_498._4_4_ = -1.0;
  local_490._0_4_ = 0.0;
  local_490._4_4_ = 0.0;
  aStack_488.x = 0.0;
  aStack_488.y = 1.0;
  aStack_488.z = 0.0;
  local_458._0_4_ = 10.0;
  local_458._4_4_ = 10.0;
  uStack_450._0_4_ = 10.0;
  uStack_450._4_4_ = -1.0;
  local_448 = 0.0;
  fStack_444 = 0.0;
  fStack_440 = 0.0;
  fStack_43c = 0.0;
  local_438 = 0.0;
  local_47c._0_4_ = 10.0;
  local_47c._4_4_ = 10.0;
  uStack_474._0_4_ = -10.0;
  uStack_474._4_4_ = -1.0;
  local_46c._0_4_ = 0.0;
  local_46c._4_4_ = 0.0;
  aStack_464.x = 1.0;
  aStack_464.y = 0.0;
  aStack_464.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_434,(SkyboxVertex *)local_4a0,
                                  (SkyboxVertex *)local_458,(SkyboxVertex *)local_47c);
  iVar2._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar2._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    this_01 = this_00;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar2,&local_4b0);
  }
  else {
    *iVar2._M_current = local_4b0;
    pmVar1 = &(this_00->super_BaseImporter).importerUnits;
    *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
  }
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -5;
  local_434._0_4_ = 0x41200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  uStack_42c = &DAT_41200000;
  local_424 = 0.0;
  fStack_420 = -1.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0._0_4_ = -10.0;
  local_4a0._4_4_ = -10.0;
  uStack_498 = &DAT_41200000;
  local_490._0_4_ = 0.0;
  local_490._4_4_ = -1.0;
  aStack_488.x = 0.0;
  aStack_488.y = 1.0;
  aStack_488.z = 0.0;
  local_458._0_4_ = -10.0;
  local_458._4_4_ = 10.0;
  uStack_450 = &DAT_41200000;
  local_448 = 0.0;
  fStack_444 = -1.0;
  fStack_440 = 0.0;
  fStack_43c = 0.0;
  local_438 = 0.0;
  local_47c._0_4_ = 10.0;
  local_47c._4_4_ = 10.0;
  uStack_474 = &DAT_41200000;
  local_46c._0_4_ = 0.0;
  local_46c._4_4_ = -1.0;
  aStack_464.x = 1.0;
  aStack_464.y = 0.0;
  aStack_464.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_434,(SkyboxVertex *)local_4a0,
                                  (SkyboxVertex *)local_458,(SkyboxVertex *)local_47c);
  iVar2._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar2._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    this_01 = this_00;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar2,&local_4b0);
  }
  else {
    *iVar2._M_current = local_4b0;
    pmVar1 = &(this_00->super_BaseImporter).importerUnits;
    *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
  }
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -4;
  local_434._0_4_ = 0xc1200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  uStack_42c._0_1_ = '\0';
  uStack_42c._1_1_ = '\0';
  uStack_42c._2_1_ = ' ';
  uStack_42c._3_1_ = 'A';
  uStack_42c._4_1_ = '\0';
  uStack_42c._5_1_ = '\0';
  uStack_42c._6_1_ = -0x80;
  uStack_42c._7_1_ = '?';
  local_424 = 0.0;
  fStack_420 = 0.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0._0_4_ = -10.0;
  local_4a0._4_4_ = -10.0;
  uStack_498._0_4_ = -10.0;
  uStack_498._4_4_ = 1.0;
  local_490._0_4_ = 0.0;
  local_490._4_4_ = 0.0;
  aStack_488.x = 0.0;
  aStack_488.y = 1.0;
  aStack_488.z = 0.0;
  local_458._0_4_ = -10.0;
  local_458._4_4_ = 10.0;
  uStack_450._0_4_ = -10.0;
  uStack_450._4_4_ = 1.0;
  local_448 = 0.0;
  fStack_444 = 0.0;
  fStack_440 = 0.0;
  fStack_43c = 0.0;
  local_438 = 0.0;
  local_47c._0_4_ = -10.0;
  local_47c._4_4_ = 10.0;
  uStack_474._0_4_ = 10.0;
  uStack_474._4_4_ = 1.0;
  local_46c._0_4_ = 0.0;
  local_46c._4_4_ = 0.0;
  aStack_464.x = 1.0;
  aStack_464.y = 0.0;
  aStack_464.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_434,(SkyboxVertex *)local_4a0,
                                  (SkyboxVertex *)local_458,(SkyboxVertex *)local_47c);
  iVar2._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar2._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    this_01 = this_00;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar2,&local_4b0);
  }
  else {
    *iVar2._M_current = local_4b0;
    pmVar1 = &(this_00->super_BaseImporter).importerUnits;
    *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
  }
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -3;
  local_434._0_4_ = 0x41200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = 'A';
  uStack_42c._0_1_ = '\0';
  uStack_42c._1_1_ = '\0';
  uStack_42c._2_1_ = ' ';
  uStack_42c._3_1_ = -0x3f;
  uStack_42c._4_1_ = '\0';
  uStack_42c._5_1_ = '\0';
  uStack_42c._6_1_ = '\0';
  uStack_42c._7_1_ = '\0';
  local_424 = -1.0;
  fStack_420 = 0.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0._0_4_ = 10.0;
  local_4a0._4_4_ = 10.0;
  uStack_498 = &DAT_41200000;
  local_490._0_4_ = -1.0;
  local_490._4_4_ = 0.0;
  aStack_488.x = 0.0;
  aStack_488.y = 1.0;
  aStack_488.z = 0.0;
  local_458._0_4_ = -10.0;
  local_458._4_4_ = 10.0;
  uStack_450 = &DAT_41200000;
  local_448 = -1.0;
  fStack_444 = 0.0;
  fStack_440 = 0.0;
  fStack_43c = 0.0;
  local_438 = 0.0;
  local_47c._0_4_ = -10.0;
  local_47c._4_4_ = 10.0;
  uStack_474._0_4_ = -10.0;
  uStack_474._4_4_ = 0.0;
  local_46c._0_4_ = -1.0;
  local_46c._4_4_ = 0.0;
  aStack_464.x = 1.0;
  aStack_464.y = 0.0;
  aStack_464.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_434,(SkyboxVertex *)local_4a0,
                                  (SkyboxVertex *)local_458,(SkyboxVertex *)local_47c);
  iVar2._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar2._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    this_01 = this_00;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar2,&local_4b0);
  }
  else {
    *iVar2._M_current = local_4b0;
    pmVar1 = &(this_00->super_BaseImporter).importerUnits;
    *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
  }
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -2;
  local_434._0_4_ = 0x41200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  uStack_42c = &DAT_41200000;
  local_424 = 1.0;
  fStack_420 = 0.0;
  fStack_41c = 0.0;
  fStack_418 = 0.0;
  local_414 = 0.0;
  local_4a0._0_4_ = 10.0;
  local_4a0._4_4_ = -10.0;
  uStack_498._0_4_ = -10.0;
  uStack_498._4_4_ = 0.0;
  local_490._0_4_ = 1.0;
  local_490._4_4_ = 0.0;
  aStack_488.x = 1.0;
  aStack_488.y = 0.0;
  aStack_488.z = 0.0;
  local_458._0_4_ = -10.0;
  local_458._4_4_ = -10.0;
  uStack_450._0_4_ = -10.0;
  uStack_450._4_4_ = 0.0;
  local_448 = 1.0;
  fStack_444 = 0.0;
  fStack_440 = 1.0;
  fStack_43c = 1.0;
  local_438 = 0.0;
  local_47c._0_4_ = -10.0;
  local_47c._4_4_ = -10.0;
  uStack_474 = &DAT_41200000;
  local_46c._0_4_ = 1.0;
  local_46c._4_4_ = 0.0;
  aStack_464.x = 0.0;
  aStack_464.y = 1.0;
  aStack_464.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(this_01,(SkyboxVertex *)local_434,(SkyboxVertex *)local_4a0,
                                  (SkyboxVertex *)local_458,(SkyboxVertex *)local_47c);
  iVar2._M_current = *(aiMesh ***)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl;
  if (iVar2._M_current ==
      *(aiMesh ***)
       &(this_00->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header._M_header) {
    std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)this_00,iVar2,&local_4b0);
  }
  else {
    *iVar2._M_current = local_4b0;
    pmVar1 = &(this_00->super_BaseImporter).importerUnits;
    *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
  }
  *(int *)(*(long *)(*(long *)&(this_00->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8
          ) = (int)((ulong)((long)(materials->
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(materials->
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  return;
}

Assistant:

void IRRImporter::BuildSkybox(std::vector<aiMesh*>& meshes, std::vector<aiMaterial*> materials)
{
    // Update the material of the skybox - replace the name and disable shading for skyboxes.
    for (unsigned int i = 0; i < 6;++i) {
        aiMaterial* out = ( aiMaterial* ) (*(materials.end()-(6-i)));

        aiString s;
        s.length = ::ai_snprintf( s.data, MAXLEN, "SkyboxSide_%u",i );
        out->AddProperty(&s,AI_MATKEY_NAME);

        int shading = aiShadingMode_NoShading;
        out->AddProperty(&shading,1,AI_MATKEY_SHADING_MODEL);
    }

    // Skyboxes are much more difficult. They are represented
    // by six single planes with different textures, so we'll
    // need to build six meshes.

    const ai_real l = 10.0; // the size used by Irrlicht

    // FRONT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l,-l,  0, 0, 1,   1.0,1.0),
        SkyboxVertex( l,-l,-l,  0, 0, 1,   0.0,1.0),
        SkyboxVertex( l, l,-l,  0, 0, 1,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, 0, 1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-6u);

    // LEFT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l,-l,  -1, 0, 0,   1.0,1.0),
        SkyboxVertex( l,-l, l,  -1, 0, 0,   0.0,1.0),
        SkyboxVertex( l, l, l,  -1, 0, 0,   0.0,0.0),
        SkyboxVertex( l, l,-l,  -1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-5u);

    // BACK SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0, 0, -1,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0, 0, -1,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, 0, -1,   0.0,0.0),
        SkyboxVertex( l, l, l,  0, 0, -1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-4u);

    // RIGHT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l, l,  1, 0, 0,   1.0,1.0),
        SkyboxVertex(-l,-l,-l,  1, 0, 0,   0.0,1.0),
        SkyboxVertex(-l, l,-l,  1, 0, 0,   0.0,0.0),
        SkyboxVertex(-l, l, l,  1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-3u);

    // TOP SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l, l,-l,  0, -1, 0,   1.0,1.0),
        SkyboxVertex( l, l, l,  0, -1, 0,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, -1, 0,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, -1, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-2u);

    // BOTTOM SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0,  1, 0,   0.0,0.0),
        SkyboxVertex( l,-l,-l,  0,  1, 0,   1.0,0.0),
        SkyboxVertex(-l,-l,-l,  0,  1, 0,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0,  1, 0,   0.0,1.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-1u);
}